

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcOpBool.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverBooleanOr(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar1;
  Mvc_List_t *pList_1;
  Mvc_List_t *pList;
  Mvc_Cube_t *pCubeCopy;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover;
  Mvc_Cover_t *pCover2_local;
  Mvc_Cover_t *pCover1_local;
  
  if (pCover1->nBits == pCover2->nBits) {
    pCover_00 = Mvc_CoverClone(pCover1);
    for (pCubeCopy = (pCover1->lCubes).pHead; pCubeCopy != (Mvc_Cube_t *)0x0;
        pCubeCopy = pCubeCopy->pNext) {
      pMVar1 = Mvc_CubeDup(pCover_00,pCubeCopy);
      if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
        (pCover_00->lCubes).pHead = pMVar1;
      }
      else {
        ((pCover_00->lCubes).pTail)->pNext = pMVar1;
      }
      (pCover_00->lCubes).pTail = pMVar1;
      pMVar1->pNext = (Mvc_Cube_t *)0x0;
      (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
    }
    for (pCubeCopy = (pCover2->lCubes).pHead; pCubeCopy != (Mvc_Cube_t *)0x0;
        pCubeCopy = pCubeCopy->pNext) {
      pMVar1 = Mvc_CubeDup(pCover_00,pCubeCopy);
      if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
        (pCover_00->lCubes).pHead = pMVar1;
      }
      else {
        ((pCover_00->lCubes).pTail)->pNext = pMVar1;
      }
      (pCover_00->lCubes).pTail = pMVar1;
      pMVar1->pNext = (Mvc_Cube_t *)0x0;
      (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
    }
    return pCover_00;
  }
  __assert_fail("pCover1->nBits == pCover2->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcOpBool.c"
                ,0x30,"Mvc_Cover_t *Mvc_CoverBooleanOr(Mvc_Cover_t *, Mvc_Cover_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mvc_Cover_t * Mvc_CoverBooleanOr( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    // make sure the covers are compatible
    assert( pCover1->nBits == pCover2->nBits );
    // clone the cover
    pCover = Mvc_CoverClone( pCover1 );
    // create the cubes by making pair-wise products
    // of cubes in pCover1 and pCover2
    Mvc_CoverForEachCube( pCover1, pCube )
    {
        pCubeCopy = Mvc_CubeDup( pCover, pCube );
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );
    }
    Mvc_CoverForEachCube( pCover2, pCube )
    {
        pCubeCopy = Mvc_CubeDup( pCover, pCube );
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );
    }
    return pCover;
}